

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void checkSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex)

{
  int iVar1;
  Verbosity VVar2;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000002a0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000340;
  char *in_stack_ffffffffffffffe8;
  Verbosity VVar3;
  
  iVar1 = ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::intParam(in_RDI,CHECKMODE);
  if ((iVar1 == 2) ||
     ((iVar1 = ::soplex::
               SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::intParam(in_RDI,CHECKMODE), iVar1 == 1 &&
      (iVar1 = ::soplex::
               SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::intParam(in_RDI,READMODE), iVar1 == 1)))) {
    checkSolutionRational<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (in_stack_00000340);
  }
  else {
    checkSolutionReal<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (in_stack_000002a0);
  }
  if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0xfffffffffffffff8) &&
     (VVar2 = ::soplex::SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar2)) {
    VVar2 = ::soplex::SPxOut::getVerbosity(&in_RDI->spxout);
    VVar3 = INFO1;
    ::soplex::SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xfffffffffffffff0);
    ::soplex::operator<<((SPxOut *)CONCAT44(VVar2,VVar3),in_stack_ffffffffffffffe8);
    ::soplex::SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xfffffffffffffff4);
  }
  return;
}

Assistant:

void checkSolution(SoPlexBase<R>& soplex)
{
   if(soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_RATIONAL
         || (soplex.intParam(SoPlexBase<R>::CHECKMODE) == SoPlexBase<R>::CHECKMODE_AUTO
             && soplex.intParam(SoPlexBase<R>::READMODE) == SoPlexBase<R>::READMODE_RATIONAL))
   {
      checkSolutionRational(soplex);
   }
   else
   {
      checkSolutionReal(soplex);
   }

   SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\n");
}